

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgky(fitsfile *fptr,int datatype,char *keyname,void *value,char *comm,int *status)

{
  uint uVar1;
  int iVar2;
  LONGLONG longval;
  ulong local_18;
  
  uVar1 = *status;
  local_18 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  if (0x27 < datatype) {
    if (datatype < 0x50) {
      if (datatype == 0x28) {
        iVar2 = ffgkyujj(fptr,keyname,&local_18,comm,status);
      }
      else {
        if (datatype != 0x29) {
          if (datatype == 0x2a) {
            ffgkye(fptr,keyname,(float *)value,comm,status);
            goto LAB_00169d71;
          }
          goto switchD_00169b07_caseD_d;
        }
        iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
      }
      if (iVar2 < 1) {
        *(ulong *)value = local_18;
      }
      goto LAB_00169d71;
    }
    switch(datatype) {
    case 0x50:
      ffgkyujj(fptr,keyname,(ULONGLONG *)value,comm,status);
      break;
    case 0x51:
      ffgkyjj(fptr,keyname,(LONGLONG *)value,comm,status);
      break;
    case 0x52:
      ffgkyd(fptr,keyname,(double *)value,comm,status);
      break;
    case 0x53:
      ffgkyc(fptr,keyname,(float *)value,comm,status);
      break;
    default:
      if (datatype == 0xa3) {
        ffgkym(fptr,keyname,(double *)value,comm,status);
        break;
      }
      goto switchD_00169b07_caseD_d;
    }
    goto LAB_00169d71;
  }
  switch(datatype) {
  case 0xb:
    iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
    if (0 < iVar2) goto LAB_00169d71;
    if (local_18 < 0x100) {
LAB_00169c65:
      *(char *)value = (char)local_18;
      goto LAB_00169d71;
    }
    break;
  case 0xc:
    iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
    if (0 < iVar2) goto LAB_00169d71;
    if ((long)(char)local_18 == local_18) goto LAB_00169c65;
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_00169b07_caseD_d:
    *status = 0x19a;
    goto LAB_00169d71;
  case 0xe:
    ffgkyl(fptr,keyname,(int *)value,comm,status);
    goto LAB_00169d71;
  case 0x10:
    ffgkys(fptr,keyname,(char *)value,comm,status);
    goto LAB_00169d71;
  case 0x14:
    iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
    if (0 < iVar2) goto LAB_00169d71;
    if (local_18 < 0x10000) {
LAB_00169cc5:
      *(short *)value = (short)local_18;
      goto LAB_00169d71;
    }
    break;
  case 0x15:
    iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
    if (0 < iVar2) goto LAB_00169d71;
    if ((long)(short)local_18 == local_18) goto LAB_00169cc5;
    break;
  default:
    if (datatype == 0x1e) {
      iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
      if (0 < iVar2) goto LAB_00169d71;
      if (local_18 >> 0x20 == 0) {
LAB_00169d6e:
        *(int *)value = (int)local_18;
        goto LAB_00169d71;
      }
    }
    else {
      if (datatype != 0x1f) goto switchD_00169b07_caseD_d;
      iVar2 = ffgkyjj(fptr,keyname,(LONGLONG *)&local_18,comm,status);
      if (0 < iVar2) goto LAB_00169d71;
      if ((long)(int)local_18 == local_18) goto LAB_00169d6e;
    }
  }
  *status = 0x19c;
LAB_00169d71:
  return *status;
}

Assistant:

int ffgky( fitsfile *fptr,     /* I - FITS file pointer        */
           int  datatype,      /* I - datatype of the value    */
           const char *keyname,      /* I - name of keyword to read  */
           void *value,        /* O - keyword value            */
           char *comm,         /* O - keyword comment          */
           int  *status)       /* IO - error status            */
/*
  Read (get) the keyword value and comment from the FITS header.
  Reads a keyword value with the datatype specified by the 2nd argument.
*/
{
    LONGLONG longval;
    ULONGLONG ulongval;
    double doubleval;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TSTRING)
    {
        ffgkys(fptr, keyname, (char *) value, comm, status);
    }
    else if (datatype == TBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > UCHAR_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned char *) value = (unsigned char) longval;
        }
    }
    else if (datatype == TSBYTE)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > 127 || longval < -128)
                *status = NUM_OVERFLOW;
            else
                *(signed char *) value = (signed char) longval;
        }
    }
    else if (datatype == TUSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned short) USHRT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned short *) value = (unsigned short) longval;
        }
    }
    else if (datatype == TSHORT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > SHRT_MAX || longval < SHRT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(short *) value = (short) longval;
        }
    }
    else if (datatype == TUINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > (unsigned int) UINT_MAX || longval < 0)
                *status = NUM_OVERFLOW;
            else
                *(unsigned int *) value = longval;
        }
    }
    else if (datatype == TINT)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > INT_MAX || longval < INT_MIN)
                *status = NUM_OVERFLOW;
            else
                *(int *) value = longval;
        }
    }
    else if (datatype == TLOGICAL)
    {
        ffgkyl(fptr, keyname, (int *) value, comm, status);
    }
    else if (datatype == TULONG)
    {
        if (ffgkyujj(fptr, keyname, &ulongval, comm, status) <= 0)
        {
            if (ulongval > ULONG_MAX)
                *status = NUM_OVERFLOW;
            else
                 *(unsigned long *) value = ulongval;
        }
    }
    else if (datatype == TLONG)
    {
        if (ffgkyjj(fptr, keyname, &longval, comm, status) <= 0)
        {
            if (longval > LONG_MAX || longval < LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *(long *) value = longval;
        }
    }
    else if (datatype == TULONGLONG)
    {
        ffgkyujj(fptr, keyname, (ULONGLONG *) value, comm, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffgkyjj(fptr, keyname, (LONGLONG *) value, comm, status);
    }
    else if (datatype == TFLOAT)
    {
        ffgkye(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffgkyd(fptr, keyname, (double *) value, comm, status);
    }
    else if (datatype == TCOMPLEX)
    {
        ffgkyc(fptr, keyname, (float *) value, comm, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
        ffgkym(fptr, keyname, (double *) value, comm, status);
    }
    else
        *status = BAD_DATATYPE;

    return(*status);
}